

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppmb_io.cpp
# Opt level: O3

bool ppmb_write_test(string *file_name)

{
  pointer pcVar1;
  bool bVar2;
  uchar *r;
  uchar *g;
  uchar *b;
  string local_48;
  
  r = (uchar *)operator_new__(40000);
  g = (uchar *)operator_new__(40000);
  b = (uchar *)operator_new__(40000);
  ppmb_example(200,200,r,g,b);
  pcVar1 = (file_name->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + file_name->_M_string_length);
  bVar2 = ppmb_write(&local_48,200,200,r,g,b);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  operator_delete__(r);
  operator_delete__(g);
  operator_delete__(b);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"PPMB_WRITE_TEST: Fatal error!\n",0x1e);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  PPMB_WRITE failed.\n",0x15);
  }
  return bVar2;
}

Assistant:

bool ppmb_write_test ( string file_name )

//****************************************************************************80
//
//  Purpose:
//
//    PPMB_WRITE_TEST tests the binary portable pixel map write routines.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    11 April 2003
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, string FILE_NAME, the name of the file to contain the binary
//    portable pixel map data.
//
//    Output, bool PPMB_WRITE_TEST is true if an error occurred.
//
{
  unsigned char *b;
  bool error;
  unsigned char *g;
  int maxrgb;
  unsigned char *r;
  int xsize;
  int ysize;

  xsize = 200;
  ysize = 200;
//
//  Allocate memory.
// 
  r = new unsigned char[ xsize * ysize ];
  g = new unsigned char[ xsize * ysize ];
  b = new unsigned char[ xsize * ysize ];
//
//  Set the data.
//
  error = ppmb_example ( xsize, ysize, r, g, b );

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE_TEST: Fatal error!\n";
    cout << "  PPM_EXAMPLE failed.\n";
    return true;
  }
//
//  Write the data to the file.
//
  error = ppmb_write ( file_name, xsize, ysize, r, g, b );

  delete [] r;
  delete [] g;
  delete [] b;

  if ( error )
  {
    cout << "\n";
    cout << "PPMB_WRITE_TEST: Fatal error!\n";
    cout << "  PPMB_WRITE failed.\n";
    return true;
  }

  return false;
}